

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O0

void __thiscall QtMWidgets::DateTimePicker::mousePressEvent(DateTimePicker *this,QMouseEvent *event)

{
  MouseButton MVar1;
  DateTimePickerPrivate *pDVar2;
  QPoint __addr_len;
  sockaddr *__addr;
  QPointF *pos;
  QPoint local_38;
  QPointF local_30;
  QPoint local_20;
  QEvent *local_18;
  QMouseEvent *event_local;
  DateTimePicker *this_local;
  
  local_18 = (QEvent *)event;
  event_local = (QMouseEvent *)this;
  MVar1 = QSinglePointEvent::button((QSinglePointEvent *)event);
  if (MVar1 == LeftButton) {
    pDVar2 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
             ::operator->(&this->d);
    pDVar2->scrolling = false;
    local_20 = QMouseEvent::pos((QMouseEvent *)local_18);
    pDVar2 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
             ::operator->(&this->d);
    pDVar2->mousePos = local_20;
    __addr_len = local_20;
    pDVar2 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
             ::operator->(&this->d);
    pDVar2->leftMouseButtonPressed = true;
    pDVar2 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
             ::operator->(&this->d);
    local_38 = QMouseEvent::pos((QMouseEvent *)local_18);
    QPointF::QPointF(&local_30,&local_38);
    pos = &local_30;
    DateTimePickerPrivate::findMovableSection(pDVar2,pos);
    QEvent::accept(local_18,(int)pos,__addr,(socklen_t *)__addr_len);
  }
  else {
    QEvent::ignore(local_18);
  }
  return;
}

Assistant:

void
DateTimePicker::mousePressEvent( QMouseEvent * event )
{
	if( event->button() == Qt::LeftButton )
	{
		d->scrolling = false;
		d->mousePos = event->pos();
		d->leftMouseButtonPressed = true;
		d->findMovableSection( event->pos() );

		event->accept();
	}
	else
		event->ignore();
}